

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::Setup::Setup
          (Setup *this,ScriptFunction *function,Arguments *args,bool bailedOut,bool inlinee,
          bool isGeneratorFrame)

{
  FunctionBody *pFVar1;
  
  this->inParams = args->Values;
  this->function = function;
  pFVar1 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  this->executeFunction = pFVar1;
  this->inSlotsCount = *(uint *)&args->Info & 0xffffff;
  this->callFlags = (uint)(byte)(args->Info).field_0x3;
  this->bailedOut = bailedOut;
  this->bailedOutOfInlinee = inlinee;
  this->isGeneratorFrame = isGeneratorFrame;
  SetupInternal(this);
  return;
}

Assistant:

InterpreterStackFrame::Setup::Setup(Js::ScriptFunction * function, Js::Arguments& args, bool bailedOut, bool inlinee, bool isGeneratorFrame)
        : function(function),
          inParams(args.Values),
          inSlotsCount(args.Info.Count),
          executeFunction(function->GetFunctionBody()),
          callFlags(args.Info.Flags),
          bailedOutOfInlinee(inlinee),
          bailedOut(bailedOut),
          isGeneratorFrame(isGeneratorFrame)
    {
        SetupInternal();
    }